

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse41_128_8.c
# Opt level: O2

void arr_store(int *array,__m256i vH,int32_t t,int32_t seglen,int32_t d,int32_t dlen,int32_t bias)

{
  long lVar1;
  ulong uVar2;
  char in_XMM0_Ba;
  char in_XMM0_Bb;
  char in_XMM0_Bc;
  char in_XMM0_Bd;
  char in_XMM0_Be;
  char in_XMM0_Bf;
  char in_XMM0_Bg;
  char in_XMM0_Bh;
  char in_YMM0_H;
  char in_register_00001211;
  char in_register_00001212;
  char in_register_00001213;
  char in_register_00001214;
  char in_register_00001215;
  char in_register_00001216;
  char in_register_00001217;
  
  uVar2 = (ulong)(uint)dlen;
  lVar1 = (long)d;
  array[uVar2 * (long)t + lVar1] = in_XMM0_Ba + 0x80;
  array[(long)(seglen + t) * uVar2 + lVar1] = in_XMM0_Bb + 0x80;
  array[(long)(t + seglen * 2) * uVar2 + lVar1] = in_XMM0_Bc + 0x80;
  array[(long)(seglen * 3 + t) * uVar2 + lVar1] = in_XMM0_Bd + 0x80;
  array[(long)(t + seglen * 4) * uVar2 + lVar1] = in_XMM0_Be + 0x80;
  array[(long)(seglen * 5 + t) * uVar2 + lVar1] = in_XMM0_Bf + 0x80;
  array[(long)(seglen * 6 + t) * uVar2 + lVar1] = in_XMM0_Bg + 0x80;
  array[(long)(seglen * 7 + t) * uVar2 + lVar1] = in_XMM0_Bh + 0x80;
  array[(long)(t + seglen * 8) * uVar2 + lVar1] = in_XMM0_Ba + 0x80;
  array[(long)(seglen * 9 + t) * uVar2 + lVar1] = in_XMM0_Bb + 0x80;
  array[(long)(seglen * 10 + t) * uVar2 + lVar1] = in_XMM0_Bc + 0x80;
  array[(long)(seglen * 0xb + t) * uVar2 + lVar1] = in_XMM0_Bd + 0x80;
  array[(long)(seglen * 0xc + t) * uVar2 + lVar1] = in_XMM0_Be + 0x80;
  array[(long)(seglen * 0xd + t) * uVar2 + lVar1] = in_XMM0_Bf + 0x80;
  array[(long)(seglen * 0xe + t) * uVar2 + lVar1] = in_XMM0_Bg + 0x80;
  array[(long)(seglen * 0xf + t) * uVar2 + lVar1] = in_XMM0_Bh + 0x80;
  array[(long)(seglen * 0x10 + t) * uVar2 + lVar1] = in_YMM0_H + 0x80;
  array[(long)(seglen * 0x11 + t) * uVar2 + lVar1] = in_register_00001211 + 0x80;
  array[(long)(seglen * 0x12 + t) * uVar2 + lVar1] = in_register_00001212 + 0x80;
  array[(long)(seglen * 0x13 + t) * uVar2 + lVar1] = in_register_00001213 + 0x80;
  array[(long)(seglen * 0x14 + t) * uVar2 + lVar1] = in_register_00001214 + 0x80;
  array[(long)(seglen * 0x15 + t) * uVar2 + lVar1] = in_register_00001215 + 0x80;
  array[(long)(seglen * 0x16 + t) * uVar2 + lVar1] = in_register_00001216 + 0x80;
  array[(long)(seglen * 0x17 + t) * uVar2 + lVar1] = in_register_00001217 + 0x80;
  array[(long)(seglen * 0x18 + t) * uVar2 + lVar1] = in_YMM0_H + 0x80;
  array[(long)(seglen * 0x19 + t) * uVar2 + lVar1] = in_register_00001211 + 0x80;
  array[(long)(seglen * 0x1a + t) * uVar2 + lVar1] = in_register_00001212 + 0x80;
  array[(long)(seglen * 0x1b + t) * uVar2 + lVar1] = in_register_00001213 + 0x80;
  array[(long)(seglen * 0x1c + t) * uVar2 + lVar1] = in_register_00001214 + 0x80;
  array[(long)(seglen * 0x1d + t) * uVar2 + lVar1] = in_register_00001215 + 0x80;
  array[(long)(seglen * 0x1e + t) * uVar2 + lVar1] = in_register_00001216 + 0x80;
  array[(long)(seglen * 0x1f + t) * uVar2 + lVar1] = in_register_00001217 + 0x80;
  return;
}

Assistant:

static inline void arr_store(
        int *array,
        __m128i vH,
        int32_t t,
        int32_t seglen,
        int32_t d,
        int32_t dlen,
        int32_t bias)
{
    array[1LL*( 0*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH,  0) - bias;
    array[1LL*( 1*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH,  1) - bias;
    array[1LL*( 2*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH,  2) - bias;
    array[1LL*( 3*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH,  3) - bias;
    array[1LL*( 4*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH,  4) - bias;
    array[1LL*( 5*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH,  5) - bias;
    array[1LL*( 6*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH,  6) - bias;
    array[1LL*( 7*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH,  7) - bias;
    array[1LL*( 8*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH,  8) - bias;
    array[1LL*( 9*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH,  9) - bias;
    array[1LL*(10*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH, 10) - bias;
    array[1LL*(11*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH, 11) - bias;
    array[1LL*(12*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH, 12) - bias;
    array[1LL*(13*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH, 13) - bias;
    array[1LL*(14*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH, 14) - bias;
    array[1LL*(15*seglen+t)*dlen + d] = (int8_t)_mm_extract_epi8(vH, 15) - bias;
}